

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O1

void __thiscall pgn::strip(pgn *this,string *token)

{
  char __c;
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  void *pvVar4;
  size_type sVar5;
  string *__range1;
  string result;
  string skip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"!?+#[]\"{}","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  sVar1 = token->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (token->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      plVar3 = local_50;
      __c = pcVar2[sVar5];
      if (local_48 == 0) {
LAB_0011dbd1:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_70,__c);
      }
      else {
        pvVar4 = memchr(local_50,(int)__c,local_48);
        if (pvVar4 == (void *)0x0 || (long)pvVar4 - (long)plVar3 == -1) goto LAB_0011dbd1;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (token,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

inline void pgn::strip(std::string& token) {
	std::string skip = "!?+#[]\"{}";
	std::string result = "";
	for (const auto& c : token) {
		if (skip.find(c) != std::string::npos) { continue; }
		else result += c;
	}
	token = result;
}